

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall
Assimp::ASEImporter::AddNodes
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes,
          aiNode *pcParent,char *szName,aiMatrix4x4 *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  BaseNode *snode;
  size_type sVar11;
  pointer pcVar12;
  _IEEESingle temp;
  int iVar13;
  ai_uint32 aVar14;
  uint uVar15;
  size_type sVar16;
  aiNode *paVar17;
  size_t sVar18;
  aiNode *paVar19;
  ulong uVar20;
  Logger *this_00;
  long *plVar21;
  long lVar22;
  aiNode **ppaVar23;
  long *plVar24;
  char *__s;
  pointer ppBVar25;
  vector<aiNode_*,_std::allocator<aiNode_*>_> apcNodes;
  aiMatrix4x4 mParentAdjust;
  aiNode **local_148;
  iterator iStack_140;
  aiNode **local_138;
  long *local_128;
  ulong local_120;
  long local_118;
  long lStack_110;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *local_d0;
  ASEImporter *local_c8;
  aiNode *local_c0;
  aiMatrix4x4t<float> local_b8;
  size_type local_70;
  aiMatrix4x4 *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0 = nodes;
  local_c8 = this;
  local_c0 = pcParent;
  local_68 = mat;
  if (szName == (char *)0x0) {
    sVar16 = 0;
  }
  else {
    sVar16 = strlen(szName);
  }
  local_148 = (aiNode **)0x0;
  iStack_140._M_current = (aiNode **)0x0;
  local_138 = (aiNode **)0x0;
  ppBVar25 = (local_d0->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_58 = (local_d0->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  sVar11 = sVar16;
  if (ppBVar25 != local_58) {
    do {
      local_70 = sVar11;
      snode = *ppBVar25;
      sVar11 = (snode->mParent)._M_string_length;
      if (szName == (char *)0x0) {
        if (sVar11 == 0) goto LAB_003f291b;
      }
      else if ((sVar16 == sVar11) &&
              (iVar13 = strcmp(szName,(snode->mParent)._M_dataplus._M_p), iVar13 == 0)) {
LAB_003f291b:
        snode->mProcessed = true;
        paVar17 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar17);
        local_b8._0_8_ = paVar17;
        if (iStack_140._M_current == local_138) {
          std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                    ((vector<aiNode*,std::allocator<aiNode*>> *)&local_148,iStack_140,
                     (aiNode **)&local_b8);
        }
        else {
          *iStack_140._M_current = paVar17;
          iStack_140._M_current = iStack_140._M_current + 1;
        }
        paVar17 = iStack_140._M_current[-1];
        local_60 = &snode->mName;
        __s = "Unnamed_Node";
        if ((snode->mName)._M_string_length != 0) {
          __s = (local_60->_M_dataplus)._M_p;
        }
        sVar18 = strlen(__s);
        aVar14 = (ai_uint32)sVar18;
        if ((int)aVar14 < 0x400) {
          (paVar17->mName).length = aVar14;
          memcpy((paVar17->mName).data,__s,(long)(int)aVar14);
          (paVar17->mName).data[(int)aVar14] = '\0';
        }
        paVar17->mParent = local_c0;
        local_b8.a1 = local_68->a1;
        local_b8.a2 = local_68->a2;
        local_b8.a3 = local_68->a3;
        local_b8.a4 = local_68->a4;
        local_b8.b1 = local_68->b1;
        local_b8.b2 = local_68->b2;
        local_b8.b3 = local_68->b3;
        local_b8.b4 = local_68->b4;
        local_b8.c1 = local_68->c1;
        local_b8.c2 = local_68->c2;
        local_b8.c3 = local_68->c3;
        local_b8.c4 = local_68->c4;
        local_b8.d1 = local_68->d1;
        local_b8.d2 = local_68->d2;
        local_b8.d3 = local_68->d3;
        local_b8.d4 = local_68->d4;
        aiMatrix4x4t<float>::Inverse(&local_b8);
        local_f8 = (snode->mTransform).b1;
        fVar1 = (snode->mTransform).a1;
        fVar2 = (snode->mTransform).a2;
        local_f4 = (snode->mTransform).c1;
        fVar3 = (snode->mTransform).d1;
        local_d4 = fVar3 * local_b8.a4 +
                   local_f4 * local_b8.a3 + fVar1 * local_b8.a1 + local_b8.a2 * local_f8;
        fVar4 = (snode->mTransform).b2;
        fVar5 = (snode->mTransform).c2;
        local_100 = (snode->mTransform).d2;
        local_d8 = local_100 * local_b8.a4 +
                   fVar5 * local_b8.a3 + fVar2 * local_b8.a1 + local_b8.a2 * fVar4;
        fVar6 = (snode->mTransform).b3;
        fVar7 = (snode->mTransform).a3;
        local_104 = (snode->mTransform).c3;
        fVar8 = (snode->mTransform).d3;
        local_dc = fVar8 * local_b8.a4 +
                   local_104 * local_b8.a3 + fVar7 * local_b8.a1 + local_b8.a2 * fVar6;
        local_108 = (snode->mTransform).b4;
        fVar9 = (snode->mTransform).a4;
        fVar10 = (snode->mTransform).c4;
        local_fc = (snode->mTransform).d4;
        local_e0 = local_b8.a4 * local_fc +
                   local_b8.a3 * fVar10 + local_b8.a1 * fVar9 + local_b8.a2 * local_108;
        local_e4 = fVar3 * local_b8.b4 +
                   local_f4 * local_b8.b3 + fVar1 * local_b8.b1 + local_b8.b2 * local_f8;
        local_e8 = local_100 * local_b8.b4 +
                   fVar5 * local_b8.b3 + fVar2 * local_b8.b1 + local_b8.b2 * fVar4;
        local_ec = fVar8 * local_b8.b4 +
                   local_104 * local_b8.b3 + fVar7 * local_b8.b1 + local_b8.b2 * fVar6;
        local_f0 = fVar3 * local_b8.c4 +
                   local_f4 * local_b8.c3 + fVar1 * local_b8.c1 + local_b8.c2 * local_f8;
        (paVar17->mTransformation).a1 = local_d4;
        (paVar17->mTransformation).a2 = local_d8;
        (paVar17->mTransformation).a3 = local_dc;
        (paVar17->mTransformation).a4 = local_e0;
        (paVar17->mTransformation).b1 = local_e4;
        (paVar17->mTransformation).b2 = local_e8;
        (paVar17->mTransformation).b3 = local_ec;
        (paVar17->mTransformation).b4 =
             local_b8.b4 * local_fc +
             local_b8.b3 * fVar10 + local_b8.b1 * fVar9 + local_b8.b2 * local_108;
        (paVar17->mTransformation).c1 = local_f0;
        (paVar17->mTransformation).c2 =
             local_100 * local_b8.c4 +
             fVar5 * local_b8.c3 + fVar2 * local_b8.c1 + local_b8.c2 * fVar4;
        (paVar17->mTransformation).c3 =
             fVar8 * local_b8.c4 +
             local_104 * local_b8.c3 + fVar7 * local_b8.c1 + local_b8.c2 * fVar6;
        (paVar17->mTransformation).c4 =
             local_b8.c4 * local_fc +
             local_b8.c3 * fVar10 + local_b8.c1 * fVar9 + local_b8.c2 * local_108;
        (paVar17->mTransformation).d1 =
             fVar3 * local_b8.d4 +
             local_f4 * local_b8.d3 + fVar1 * local_b8.d1 + local_f8 * local_b8.d2;
        (paVar17->mTransformation).d2 =
             local_100 * local_b8.d4 +
             fVar5 * local_b8.d3 + fVar2 * local_b8.d1 + fVar4 * local_b8.d2;
        (paVar17->mTransformation).d3 =
             fVar8 * local_b8.d4 +
             local_104 * local_b8.d3 + fVar7 * local_b8.d1 + fVar6 * local_b8.d2;
        (paVar17->mTransformation).d4 =
             local_fc * local_b8.d4 +
             fVar10 * local_b8.d3 + fVar9 * local_b8.d1 + local_b8.d2 * local_108;
        paVar19 = paVar17->mParent;
        uVar15 = (paVar17->mName).length;
        if (((uVar15 != (paVar19->mName).length) ||
            (iVar13 = bcmp((paVar17->mName).data,(paVar19->mName).data,(ulong)uVar15), iVar13 != 0))
           && ((uVar15 != (paVar19->mParent->mName).length ||
               (iVar13 = bcmp((paVar17->mName).data,(paVar19->mParent->mName).data,(ulong)uVar15),
               iVar13 != 0)))) {
          AddNodes(local_c8,local_d0,paVar17,(paVar17->mName).data,&snode->mTransform);
        }
        if (snode->mType == Mesh) {
          AddMeshes(local_c8,snode,paVar17);
          sVar16 = local_70;
        }
        else {
          fVar1 = (snode->mTargetPosition).x;
          sVar16 = local_70;
          if ((~(uint)fVar1 & 0x7f800000) != 0 || ((uint)fVar1 & 0x7fffff) == 0) {
            if (paVar17->mNumChildren == 0) {
              ppaVar23 = (aiNode **)operator_new__(8);
              paVar17->mChildren = ppaVar23;
            }
            paVar19 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar19);
            pcVar12 = (snode->mName)._M_dataplus._M_p;
            local_128 = &local_118;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,pcVar12,pcVar12 + (snode->mName)._M_string_length);
            std::__cxx11::string::append((char *)&local_128);
            uVar20 = local_120;
            if (local_120 < 0x400) {
              (paVar19->mName).length = (ai_uint32)local_120;
              memcpy((paVar19->mName).data,local_128,local_120);
              (paVar19->mName).data[uVar20] = '\0';
            }
            if (local_128 != &local_118) {
              operator_delete(local_128);
            }
            (paVar19->mTransformation).a4 = (snode->mTargetPosition).x - (snode->mTransform).a4;
            (paVar19->mTransformation).b4 = (snode->mTargetPosition).y - (snode->mTransform).b4;
            (paVar19->mTransformation).c4 = (snode->mTargetPosition).z - (snode->mTransform).c4;
            paVar19->mParent = paVar17;
            if (paVar17->mNumChildren != 0) {
              uVar20 = 0;
              do {
                paVar17->mChildren[uVar20 + 1] = paVar17->mChildren[uVar20];
                uVar20 = uVar20 + 1;
              } while (uVar20 < paVar17->mNumChildren);
            }
            *paVar17->mChildren = paVar19;
            paVar17->mNumChildren = paVar17->mNumChildren + 1;
            this_00 = DefaultLogger::get();
            std::operator+(&local_50,"ASE: Generating separate target node (",local_60);
            plVar21 = (long *)std::__cxx11::string::append((char *)&local_50);
            plVar24 = plVar21 + 2;
            if ((long *)*plVar21 == plVar24) {
              local_118 = *plVar24;
              lStack_110 = plVar21[3];
              local_128 = &local_118;
            }
            else {
              local_118 = *plVar24;
              local_128 = (long *)*plVar21;
            }
            local_120 = plVar21[1];
            *plVar21 = (long)plVar24;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            Logger::debug(this_00,(char *)local_128);
            if (local_128 != &local_118) {
              operator_delete(local_128);
            }
            sVar16 = local_70;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
              sVar16 = local_70;
            }
          }
        }
      }
      ppBVar25 = ppBVar25 + 1;
      sVar11 = local_70;
    } while (ppBVar25 != local_58);
  }
  paVar17 = local_c0;
  lVar22 = (long)iStack_140._M_current - (long)local_148 >> 3;
  local_c0->mNumChildren = (uint)lVar22;
  if ((uint)lVar22 != 0) {
    ppaVar23 = (aiNode **)operator_new__(-(ulong)(lVar22 + 1U >> 0x3d != 0) | lVar22 * 8 + 8U);
    paVar17->mChildren = ppaVar23;
    if (iStack_140._M_current != local_148) {
      uVar15 = 1;
      uVar20 = 0;
      do {
        paVar17->mChildren[uVar20] = local_148[uVar20];
        uVar20 = (ulong)uVar15;
        uVar15 = uVar15 + 1;
      } while (uVar20 < (ulong)((long)iStack_140._M_current - (long)local_148 >> 3));
    }
  }
  if (local_148 != (aiNode **)0x0) {
    operator_delete(local_148);
  }
  return;
}

Assistant:

void ASEImporter::AddNodes (const std::vector<BaseNode*>& nodes,
    aiNode* pcParent, const char* szName,
    const aiMatrix4x4& mat)
{
    const size_t len = szName ? ::strlen(szName) : 0;
    ai_assert(4 <= AI_MAX_NUMBER_OF_COLOR_SETS);

    // Receives child nodes for the pcParent node
    std::vector<aiNode*> apcNodes;

    // Now iterate through all nodes in the scene and search for one
    // which has *us* as parent.
    for (std::vector<BaseNode*>::const_iterator it = nodes.begin(), end = nodes.end(); it != end; ++it) {
        const BaseNode* snode = *it;
        if (szName) {
            if (len != snode->mParent.length() || ::strcmp(szName,snode->mParent.c_str()))
                continue;
        }
        else if (snode->mParent.length())
            continue;

        (*it)->mProcessed = true;

        // Allocate a new node and add it to the output data structure
        apcNodes.push_back(new aiNode());
        aiNode* node = apcNodes.back();

        node->mName.Set((snode->mName.length() ? snode->mName.c_str() : "Unnamed_Node"));
        node->mParent = pcParent;

        // Setup the transformation matrix of the node
        aiMatrix4x4 mParentAdjust  = mat;
        mParentAdjust.Inverse();
        node->mTransformation = mParentAdjust*snode->mTransform;

        // Add sub nodes - prevent stack overflow due to recursive parenting
        if (node->mName != node->mParent->mName && node->mName != node->mParent->mParent->mName ) {
            AddNodes(nodes,node,node->mName.data,snode->mTransform);
        }

        // Further processing depends on the type of the node
        if (snode->mType == ASE::BaseNode::Mesh)    {
            // If the type of this node is "Mesh" we need to search
            // the list of output meshes in the data structure for
            // all those that belonged to this node once. This is
            // slightly inconvinient here and a better solution should
            // be used when this code is refactored next.
            AddMeshes(snode,node);
        }
        else if (is_not_qnan( snode->mTargetPosition.x ))   {
            // If this is a target camera or light we generate a small
            // child node which marks the position of the camera
            // target (the direction information is contained in *this*
            // node's animation track but the exact target position
            // would be lost otherwise)
            if (!node->mNumChildren)    {
                node->mChildren = new aiNode*[1];
            }

            aiNode* nd = new aiNode();

            nd->mName.Set ( snode->mName + ".Target" );

            nd->mTransformation.a4 = snode->mTargetPosition.x - snode->mTransform.a4;
            nd->mTransformation.b4 = snode->mTargetPosition.y - snode->mTransform.b4;
            nd->mTransformation.c4 = snode->mTargetPosition.z - snode->mTransform.c4;

            nd->mParent = node;

            // The .Target node is always the first child node
            for (unsigned int m = 0; m < node->mNumChildren;++m)
                node->mChildren[m+1] = node->mChildren[m];

            node->mChildren[0] = nd;
            node->mNumChildren++;

            // What we did is so great, it is at least worth a debug message
            ASSIMP_LOG_DEBUG("ASE: Generating separate target node ("+snode->mName+")");
        }
    }

    // Allocate enough space for the child nodes
    // We allocate one slot more  in case this is a target camera/light
    pcParent->mNumChildren = (unsigned int)apcNodes.size();
    if (pcParent->mNumChildren) {
        pcParent->mChildren = new aiNode*[apcNodes.size()+1 /* PLUS ONE !!! */];

        // now build all nodes for our nice new children
        for (unsigned int p = 0; p < apcNodes.size();++p)
            pcParent->mChildren[p] = apcNodes[p];
    }
    return;
}